

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_integrate(ref_metric_integrand integrand,void *state,REF_DBL *integral)

{
  uint uVar1;
  double dStack_40;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL value;
  REF_DBL t;
  REF_DBL *pRStack_28;
  REF_INT i;
  REF_DBL *integral_local;
  void *state_local;
  ref_metric_integrand integrand_local;
  
  *integral = 0.0;
  t._4_4_ = 0;
  pRStack_28 = integral;
  integral_local = (REF_DBL *)state;
  state_local = integrand;
  while( true ) {
    if (nq <= t._4_4_) {
      return 0;
    }
    value = tq[t._4_4_] * 0.5 + 0.5;
    uVar1 = (*(code *)state_local)(value,integral_local,&stack0xffffffffffffffc0);
    if (uVar1 != 0) break;
    *pRStack_28 = wq[t._4_4_] * 0.5 * dStack_40 + *pRStack_28;
    t._4_4_ = t._4_4_ + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xe17,
         "ref_metric_integrate",(ulong)uVar1,"eval");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrate(ref_metric_integrand integrand,
                                        void *state, REF_DBL *integral) {
  REF_INT i;
  REF_DBL t;
  REF_DBL value;
  *integral = 0.0;
  for (i = 0; i < nq; i++) {
    t = 0.5 * tq[i] + 0.5;
    RSS(integrand(state, t, &value), "eval");
    *integral += 0.5 * wq[i] * value;
  }

  return REF_SUCCESS;
}